

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O2

void worker_config_init(worker_config_conflict *wc,int use_broadcast,signal_func signal_f,
                       wait_func wait_f)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_30;
  
  memset(wc,0,0xa8);
  wc->signal_cond = signal_f;
  wc->wait_cond = wait_f;
  wc->use_broadcast = use_broadcast;
  iVar1 = uv_sem_init(wc,0);
  if (iVar1 == 0) {
    iVar1 = uv_sem_init(&wc->sem_signaled,0);
    if (iVar1 == 0) {
      iVar1 = uv_cond_init(&wc->cond);
      if (iVar1 == 0) {
        iVar1 = uv_mutex_init(&wc->mutex);
        if (iVar1 == 0) {
          return;
        }
        pcVar2 = "0 == uv_mutex_init(&wc->mutex)";
        uStack_30 = 0x3d;
      }
      else {
        pcVar2 = "0 == uv_cond_init(&wc->cond)";
        uStack_30 = 0x3c;
      }
    }
    else {
      pcVar2 = "0 == uv_sem_init(&wc->sem_signaled, 0)";
      uStack_30 = 0x3b;
    }
  }
  else {
    pcVar2 = "0 == uv_sem_init(&wc->sem_waiting, 0)";
    uStack_30 = 0x3a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-condvar.c"
          ,uStack_30,pcVar2);
  abort();
}

Assistant:

void worker_config_init(worker_config* wc,
                        int use_broadcast,
                        signal_func signal_f,
                        wait_func wait_f) {
  /* Wipe. */
  memset(wc, 0, sizeof(*wc));

  /* Copy vars. */
  wc->signal_cond = signal_f;
  wc->wait_cond = wait_f;
  wc->use_broadcast = use_broadcast;

  /* Init. */
  ASSERT(0 == uv_sem_init(&wc->sem_waiting, 0));
  ASSERT(0 == uv_sem_init(&wc->sem_signaled, 0));
  ASSERT(0 == uv_cond_init(&wc->cond));
  ASSERT(0 == uv_mutex_init(&wc->mutex));
}